

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::impl::
     distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
     ::distribute_inplace
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *c,comm *comm)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  unsigned_long total_size;
  long lVar5;
  size_type_conflict __new_size;
  size_t local_size;
  vector<long,_std::allocator<long>_> surpluses;
  signed_size_t surplus;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  unsigned_long local_80;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  long local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  if (comm->m_size != 1) {
    local_80 = (long)(c->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(c->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
    total_size = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_80);
    __new_size = total_size / (uint)comm->m_size +
                 (ulong)((ulong)(uint)comm->m_rank < total_size % (ulong)(uint)comm->m_size);
    bVar4 = any_of(local_80 == total_size,comm);
    if (bVar4) {
      local_78._M_impl.super__Vector_impl_data._M_start = (pair<int,_int> *)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_78,
                 __new_size);
      distribute_scatter<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
                 (c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )local_78._M_impl.super__Vector_impl_data._M_start,total_size,comm);
      ppVar1 = (c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppVar2 = (c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      (c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = local_78._M_impl.super__Vector_impl_data._M_start;
      (c->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = local_78._M_impl.super__Vector_impl_data._M_finish;
      local_78._M_impl.super__Vector_impl_data._M_start = ppVar2;
      local_78._M_impl.super__Vector_impl_data._M_finish = ppVar3;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&local_78);
    }
    else {
      local_60 = local_80 - __new_size;
      allgather<long>((vector<long,_std::allocator<long>_> *)&local_78,&local_60,comm);
      lVar5 = 0;
      for (; local_78._M_impl.super__Vector_impl_data._M_start !=
             local_78._M_impl.super__Vector_impl_data._M_finish;
          local_78._M_impl.super__Vector_impl_data._M_start =
               local_78._M_impl.super__Vector_impl_data._M_start + 1) {
        lVar5 = lVar5 + (long)*local_78._M_impl.super__Vector_impl_data._M_start;
      }
      if (lVar5 != 0) {
        assert_fail("std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                    ,0x147,"distribute_inplace");
      }
      surplus_send_pairing
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
                 (vector<long,_std::allocator<long>_> *)&local_78,comm->m_size,comm->m_rank,false);
      all2all<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,comm);
      if (local_60 < 1) {
        lVar5 = 0;
        for (; local_58._M_impl.super__Vector_impl_data._M_start !=
               local_58._M_impl.super__Vector_impl_data._M_finish;
            local_58._M_impl.super__Vector_impl_data._M_start =
                 local_58._M_impl.super__Vector_impl_data._M_start + 1) {
          lVar5 = lVar5 + *local_58._M_impl.super__Vector_impl_data._M_start;
        }
        if (lVar5 != 0) {
          assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                      ,0x153,"distribute_inplace");
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                  (c,__new_size);
        all2allv<std::pair<int,int>>
                  ((pair<int,_int> *)0x0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
                   (c->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start + local_80,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,comm);
      }
      else {
        lVar5 = 0;
        for (; local_40._M_impl.super__Vector_impl_data._M_start !=
               local_40._M_impl.super__Vector_impl_data._M_finish;
            local_40._M_impl.super__Vector_impl_data._M_start =
                 local_40._M_impl.super__Vector_impl_data._M_start + 1) {
          lVar5 = lVar5 + *local_40._M_impl.super__Vector_impl_data._M_start;
        }
        if (lVar5 != 0) {
          assert_fail("std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                      ,0x14e,"distribute_inplace");
        }
        all2allv<std::pair<int,int>>
                  ((c->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start + (local_80 - local_60),
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
                   (pair<int,_int> *)0x0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,comm);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
                  (c,__new_size);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&local_78);
    }
  }
  return;
}

Assistant:

inline static void distribute_inplace(Container& c, const mxx::comm& comm) {
        // custom implementation: don't need full sized buffers, only for receiving surpluses)
        // if single process, don't do anything
        if (comm.size() == 1)
            return;

        typedef typename std::iterator_traits<decltype(std::begin(c))>::value_type T;

        // get sizes
        size_t local_size = c.size();
        size_t total_size = mxx::allreduce(local_size, comm);
        blk_dist part(total_size, comm.size(), comm.rank());

        if (mxx::any_of(local_size == total_size, comm)) {
            // use scatterv instead of all2all based communication
            Container result;
            result.resize(part.local_size());
            impl::distribute_scatter(std::begin(c), std::end(c), std::begin(result), total_size, comm);
            c.swap(result);
        } else {
            // use surplus send-pairing to minimize total communication volume
            // TODO: use all2all or send/recv depending on the maximum number of
            //       paired processes

            // get surplus
            impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

            // allgather surpluses
            // TODO figure out how to do surplus send pairing without requiring allgather
            std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
            MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0);

            // get send counts
            std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
            std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

            if (surplus > 0) {
                MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0);
                // TODO: use iterators not pointers
                mxx::all2allv(&(*(std::begin(c)+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
                c.resize(part.local_size());
            } else {
                MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0);
                c.resize(part.local_size());
                mxx::all2allv((T*)nullptr, send_counts, &(*(std::begin(c)+local_size)), recv_counts, comm);
            }
        }
    }